

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

VisitStatus
Fixpp::impl::
visitDictionary<should_skip_unknown_tags::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>,should_skip_unknown_tags::VisitRules>
          (long context,undefined8 visitor)

{
  uint64_t uVar1;
  VisitStatus VVar2;
  
  VVar2 = VersionMismatch;
  if (*(long *)(context + 0x48) == 7) {
    uVar1 = getAsciiStringAsIntRecConst(*(char **)(context + 0x40),7,0,0);
    if (((uVar1 == 0x342e342e584946) && (VVar2 = NotFound, *(long *)(context + 0x60) == 1)) &&
       (**(char **)(context + 0x58) == 'W')) {
      MessageVisitor<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>::
      operator()(visitor);
      VVar2 = Ok;
    }
  }
  return VVar2;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }